

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::Bloaty::AddBuiltInSources<10ul>
          (Bloaty *this,DataSourceDefinition (*sources) [10],Options *options)

{
  pointer __p;
  DataSource DVar1;
  __uniq_ptr_impl<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
  *this_00;
  long lVar2;
  __single_object configured_source;
  allocator<char> local_61;
  pointer local_60;
  Options *local_58;
  key_type local_50;
  
  local_58 = options;
  for (lVar2 = 0; lVar2 != 0xf0; lVar2 = lVar2 + 0x18) {
    std::make_unique<bloaty::ConfiguredDataSource,bloaty::DataSourceDefinition_const&>
              ((DataSourceDefinition *)&local_60);
    if (local_60->effective_source == kSymbols) {
      DVar1 = EffectiveSymbolSource(local_58);
      local_60->effective_source = DVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)((long)&(*sources)[0].name + lVar2),&local_61);
    this_00 = (__uniq_ptr_impl<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>_>
                 ::operator[](&this->all_known_sources_,&local_50);
    __p = local_60;
    local_60 = (pointer)0x0;
    std::
    __uniq_ptr_impl<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
    ::reset(this_00,__p);
    std::__cxx11::string::~string((string *)&local_50);
    std::
    unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>::
    ~unique_ptr((unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>
                 *)&local_60);
  }
  return;
}

Assistant:

void AddBuiltInSources(const DataSourceDefinition (&sources)[T],
                         const Options& options) {
    for (size_t i = 0; i < T; i++) {
      const DataSourceDefinition& source = sources[i];
      auto configured_source = absl::make_unique<ConfiguredDataSource>(source);

      if (configured_source->effective_source == DataSource::kSymbols) {
        configured_source->effective_source = EffectiveSymbolSource(options);
      }

      all_known_sources_[source.name] = std::move(configured_source);
    }
  }